

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

uint8_t * google::protobuf::internal::WireFormatLite::InternalWriteGroup
                    (int field_number,MessageLite *value,uint8_t *target,EpsCopyOutputStream *stream
                    )

{
  int iVar1;
  uint8_t *puVar2;
  undefined4 extraout_var;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MessageLite *value_local;
  int field_number_local;
  
  puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  puVar2 = WriteTagToArray(field_number,WIRETYPE_START_GROUP,puVar2);
  iVar1 = (*value->_vptr_MessageLite[5])(value,puVar2,stream);
  puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)CONCAT44(extraout_var,iVar1));
  puVar2 = WriteTagToArray(field_number,WIRETYPE_END_GROUP,puVar2);
  return puVar2;
}

Assistant:

uint8_t* WireFormatLite::InternalWriteGroup(int field_number,
                                            const MessageLite& value,
                                            uint8_t* target,
                                            io::EpsCopyOutputStream* stream) {
  target = stream->EnsureSpace(target);
  target = WriteTagToArray(field_number, WIRETYPE_START_GROUP, target);
  target = value._InternalSerialize(target, stream);
  target = stream->EnsureSpace(target);
  return WriteTagToArray(field_number, WIRETYPE_END_GROUP, target);
}